

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O2

void __thiscall RangeLock_LockUnlock_Test::TestBody(RangeLock_LockUnlock_Test *this)

{
  TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *pTVar1;
  TypedExpectation<void_(unsigned_long,_unsigned_long)> *pTVar2;
  pointer *__ptr;
  MatcherBase<pstore::file::file_base::blocking_mode> *gmock_a3;
  MatcherBase<unsigned_long> local_4d8;
  MatcherBase<pstore::file::file_base::lock_kind> local_4c0;
  AssertionResult gtest_ar_;
  _Any_data local_490 [3];
  ReturnAction<bool> local_460;
  Expectation file_lock;
  MatcherBase<pstore::file::file_base::blocking_mode> local_440;
  range_lock lock;
  mock_file file;
  
  anon_unknown.dwarf_146a0::mock_file::mock_file(&file);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&gtest_ar_,5);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_4d8,7);
  testing::Matcher<pstore::file::file_base::lock_kind>::Matcher
            ((Matcher<pstore::file::file_base::lock_kind> *)&local_4c0,exclusive_write);
  testing::Matcher<pstore::file::file_base::blocking_mode>::Matcher
            ((Matcher<pstore::file::file_base::blocking_mode> *)&local_440,blocking);
  gmock_a3 = &local_440;
  anon_unknown.dwarf_146a0::mock_file::gmock_lock
            ((MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
              *)&lock,&file,(Matcher<unsigned_long> *)&gtest_ar_,
             (Matcher<unsigned_long> *)&local_4d8,
             (Matcher<pstore::file::file_base::lock_kind> *)&local_4c0,
             (Matcher<pstore::file::file_base::blocking_mode> *)gmock_a3);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::
           MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           ::InternalExpectedAt
                     ((MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
                       *)&lock,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                      ,0xfa,"file",
                      "lock (5UL, std::size_t{7}, mock_file::lock_kind::exclusive_write, mock_file::blocking_mode::blocking)"
                     );
  testing::internal::ReturnAction<bool>::ReturnAction(&local_460,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
              *)local_490,(ReturnAction *)&local_460);
  pTVar1 = testing::internal::
           TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           ::WillOnce(pTVar1,(Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
                              *)local_490);
  testing::Expectation::Expectation(&file_lock,&pTVar1->super_ExpectationBase);
  std::_Function_base::~_Function_base((_Function_base *)local_490);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_460.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  _Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>,_testing::Matcher<pstore::file::file_base::lock_kind>,_testing::Matcher<pstore::file::file_base::blocking_mode>_>
                  *)&lock.offset_);
  testing::internal::MatcherBase<pstore::file::file_base::blocking_mode>::~MatcherBase(&local_440);
  testing::internal::MatcherBase<pstore::file::file_base::lock_kind>::~MatcherBase(&local_4c0);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_4d8);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&gtest_ar_);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&gtest_ar_,5);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_4d8,7);
  anon_unknown.dwarf_146a0::mock_file::gmock_unlock
            ((MockSpec<void_(unsigned_long,_unsigned_long)> *)&lock,&file,
             (Matcher<unsigned_long> *)&gtest_ar_,(Matcher<unsigned_long> *)&local_4d8);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::InternalExpectedAt
                     ((MockSpec<void_(unsigned_long,_unsigned_long)> *)&lock,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                      ,0xfc,"file","unlock (5UL, std::size_t{7})");
  pTVar2 = testing::internal::TypedExpectation<void_(unsigned_long,_unsigned_long)>::Times(pTVar2,1)
  ;
  testing::ExpectationSet::ExpectationSet((ExpectationSet *)local_490,&file_lock);
  testing::internal::TypedExpectation<void_(unsigned_long,_unsigned_long)>::After
            (pTVar2,(ExpectationSet *)local_490);
  std::
  _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
  ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
               *)local_490);
  std::_Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>_>::
  ~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_long>_>
                *)&lock.offset_);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_4d8);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&gtest_ar_);
  pstore::file::range_lock::range_lock(&lock,&file.super_file_base,5,7,exclusive_write);
  pstore::file::range_lock::lock(&lock);
  gtest_ar_.success_ = lock.locked_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (lock.locked_ == false) {
    testing::Message::Message((Message *)&local_4d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_490,(internal *)&gtest_ar_,(AssertionResult *)0x18062b,"false","true"
               ,(char *)gmock_a3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x103,(char *)local_490[0]._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4c0,(Message *)&local_4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4c0);
    std::__cxx11::string::~string((string *)local_490[0]._M_pod_data);
    if (local_4d8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
        (_func_int **)0x0) {
      (**(code **)(*local_4d8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  pstore::file::range_lock::unlock(&lock);
  gtest_ar_.success_ = (bool)(lock.locked_ ^ 1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (lock.locked_ == true) {
    testing::Message::Message((Message *)&local_4d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_490,(internal *)&gtest_ar_,(AssertionResult *)0x18062b,"true","false"
               ,(char *)gmock_a3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x105,(char *)local_490[0]._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4c0,(Message *)&local_4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4c0);
    std::__cxx11::string::~string((string *)local_490[0]._M_pod_data);
    if (local_4d8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
        (_func_int **)0x0) {
      (**(code **)(*local_4d8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  pstore::file::range_lock::~range_lock(&lock);
  testing::Expectation::~Expectation(&file_lock);
  anon_unknown.dwarf_146a0::mock_file::~mock_file(&file);
  return;
}

Assistant:

TEST (RangeLock, LockUnlock) {
    mock_file file;

    // Set up the test expectations.
    using ::testing::_;
    using ::testing::Expectation;
    using ::testing::Return;

    Expectation file_lock = EXPECT_CALL (file, lock (UINT64_C (5), std::size_t{7},
                                                     mock_file::lock_kind::exclusive_write,
                                                     mock_file::blocking_mode::blocking))
                                .WillOnce (Return (true));
    EXPECT_CALL (file, unlock (UINT64_C (5), std::size_t{7})).Times (1).After (file_lock);

    pstore::file::range_lock lock (&file,
                                   UINT64_C (5),   // offset
                                   std::size_t{7}, // size
                                   mock_file::lock_kind::exclusive_write);
    lock.lock ();
    EXPECT_TRUE (lock.is_locked ());
    lock.unlock ();
    EXPECT_FALSE (lock.is_locked ());
}